

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

bool __thiscall MP1Node::recvMembershipList(MP1Node *this,void *env,char *data,int size,char *label)

{
  int iVar1;
  long heartbeat;
  int iStack_5c;
  short port;
  int id;
  int i;
  MemberListEntry entry;
  long numberOfMembers;
  char *label_local;
  int *piStack_28;
  int size_local;
  char *data_local;
  void *env_local;
  MP1Node *this_local;
  
  entry.timestamp = *(long *)data;
  piStack_28 = (int *)(data + 8);
  if (size + -8 < (int)entry.timestamp * 0xe) {
    this_local._7_1_ = false;
  }
  else {
    MemberListEntry::MemberListEntry((MemberListEntry *)&id);
    for (iStack_5c = 0; iStack_5c < entry.timestamp; iStack_5c = iStack_5c + 1) {
      id = *piStack_28;
      i._0_2_ = (short)piStack_28[1];
      entry._0_8_ = *(undefined8 *)((long)piStack_28 + 6);
      piStack_28 = (int *)((long)piStack_28 + 0xe);
      iVar1 = Params::getcurrtime(this->par);
      entry.heartbeat = (long)iVar1;
      updateMembershipList(this,id,(short)i,entry._0_8_);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MP1Node::recvMembershipList(void *env, char *data, int size, const char * label) {

    //get the number of members
    long numberOfMembers;
    memcpy(&numberOfMembers, data, sizeof(long));
    data += sizeof(long);
    size -= sizeof(long);

    if (size < (int)(numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)))) {
        return false;
    }

    //extract each member from data and update own membership list
    MemberListEntry entry;
    for (int i = 0; i < numberOfMembers; i++) {

        memcpy(&entry.id, data, sizeof(int));
        data += sizeof(int);
        memcpy(&entry.port, data, sizeof(short));
        data += sizeof(short);
        memcpy(&entry.heartbeat, data, sizeof(long));
        data += sizeof(long);
        entry.timestamp = par->getcurrtime();

        int id = entry.id;
        short port = entry.port;
        long heartbeat = entry.heartbeat;

        updateMembershipList(id, port, heartbeat);
    }

    return true;
}